

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

whisper_context *
whisper_init_with_params_no_state(whisper_model_loader *loader,whisper_context_params params)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  whisper_context_params wVar4;
  bool bVar5;
  undefined8 uVar6;
  whisper_context *wctx;
  
  wVar4 = params;
  ggml_time_init();
  if ((params.flash_attn == 1) &&
     (((undefined1  [48])params & (undefined1  [48])0x1) != (undefined1  [48])0x0)) {
    whisper_log_internal
              (GGML_LOG_LEVEL_WARN,
               "%s: dtw_token_timestamps is not supported with flash_attn - disabling\n",
               "whisper_init_with_params_no_state");
    params.dtw_token_timestamps = false;
  }
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: use gpu    = %d\n","whisper_init_with_params_no_state",
             (ulong)params.use_gpu);
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: flash attn = %d\n","whisper_init_with_params_no_state",
             (ulong)(uint)params.flash_attn);
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: gpu_device = %d\n","whisper_init_with_params_no_state",
             (ulong)(uint)params.gpu_device);
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: dtw        = %d\n","whisper_init_with_params_no_state",
             (ulong)params.dtw_token_timestamps);
  uVar6 = ggml_backend_dev_count();
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: devices    = %zu\n","whisper_init_with_params_no_state",uVar6)
  ;
  uVar6 = ggml_backend_reg_count();
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: backends   = %zu\n","whisper_init_with_params_no_state",uVar6)
  ;
  wctx = (whisper_context *)operator_new(0x248);
  wctx->t_load_us = 0;
  wctx->t_start_us = 0;
  wctx->wtype = GGML_TYPE_F16;
  wctx->itype = GGML_TYPE_F16;
  (wctx->model).type = MODEL_UNKNOWN;
  (wctx->model).hparams.n_vocab = 0xca98;
  (wctx->model).hparams.n_audio_ctx = 0x5dc;
  (wctx->model).hparams.n_audio_state = 0x180;
  (wctx->model).hparams.n_audio_head = 6;
  (wctx->model).hparams.n_audio_layer = 4;
  (wctx->model).hparams.n_text_ctx = 0x1c0;
  (wctx->model).hparams.n_text_state = 0x180;
  (wctx->model).hparams.n_text_head = 6;
  (wctx->model).hparams.n_text_layer = 4;
  (wctx->model).hparams.n_mels = 0x50;
  (wctx->model).hparams.ftype = 1;
  (wctx->model).hparams.eps = 1e-05;
  (wctx->model).filters.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (wctx->model).filters.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (wctx->model).filters.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(wctx->model).tensors._M_t._M_impl.super__Rb_tree_header;
  (wctx->model).tensors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (wctx->model).tensors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (wctx->model).layers_encoder.
  super__Vector_base<whisper_layer_encoder,_std::allocator<whisper_layer_encoder>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (wctx->model).layers_encoder.
  super__Vector_base<whisper_layer_encoder,_std::allocator<whisper_layer_encoder>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (wctx->model).layers_encoder.
  super__Vector_base<whisper_layer_encoder,_std::allocator<whisper_layer_encoder>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (wctx->model).layers_decoder.
  super__Vector_base<whisper_layer_decoder,_std::allocator<whisper_layer_decoder>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (wctx->model).layers_decoder.
  super__Vector_base<whisper_layer_decoder,_std::allocator<whisper_layer_decoder>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (wctx->model).layers_decoder.
  super__Vector_base<whisper_layer_decoder,_std::allocator<whisper_layer_decoder>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (wctx->model).ctxs.super__Vector_base<ggml_context_*,_std::allocator<ggml_context_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (wctx->model).ctxs.super__Vector_base<ggml_context_*,_std::allocator<ggml_context_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (wctx->model).ctxs.super__Vector_base<ggml_context_*,_std::allocator<ggml_context_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (wctx->model).buffers.
  super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (wctx->model).buffers.
  super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (wctx->model).buffers.
  super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (wctx->model).tensors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (wctx->model).tensors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (wctx->model).tensors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (wctx->vocab).n_vocab = 0xca98;
  p_Var1 = &(wctx->vocab).token_to_id._M_t._M_impl.super__Rb_tree_header;
  (wctx->vocab).token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (wctx->vocab).token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (wctx->vocab).token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (wctx->vocab).token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (wctx->vocab).token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(wctx->vocab).id_to_token._M_t._M_impl.super__Rb_tree_header;
  (wctx->vocab).id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (wctx->vocab).id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (wctx->vocab).id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (wctx->vocab).id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (wctx->vocab).id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (wctx->vocab).token_eot = 0xc450;
  (wctx->vocab).token_sot = 0xc451;
  (wctx->vocab).token_translate = 0xc4b5;
  (wctx->vocab).token_transcribe = 0xc4b6;
  (wctx->vocab).token_solm = 0xc4b7;
  (wctx->vocab).token_prev = 0xc4b8;
  (wctx->vocab).token_nosp = 0xc4b9;
  (wctx->vocab).token_not = 0xc4ba;
  (wctx->vocab).token_beg = 0xc4bb;
  wctx->state = (whisper_state *)0x0;
  paVar2 = &(wctx->path_model).field_2;
  (wctx->path_model)._M_dataplus._M_p = (pointer)paVar2;
  (wctx->path_model)._M_string_length = 0;
  (wctx->path_model).field_2._M_local_buf[0] = '\0';
  uVar6 = wVar4._0_8_;
  (wctx->params).dtw_aheads.heads = params.dtw_aheads.heads;
  (wctx->params).dtw_mem_size = params.dtw_mem_size;
  (wctx->params).dtw_n_top = params.dtw_n_top;
  *(undefined4 *)&(wctx->params).field_0x14 = params._20_4_;
  (wctx->params).dtw_aheads.n_heads = params.dtw_aheads.n_heads;
  (wctx->params).use_gpu = (bool)(char)uVar6;
  (wctx->params).flash_attn = (bool)(char)((ulong)uVar6 >> 8);
  *(short *)&(wctx->params).field_0x2 = (short)((ulong)uVar6 >> 0x10);
  (wctx->params).gpu_device = (int)((ulong)uVar6 >> 0x20);
  (wctx->params).dtw_token_timestamps = params.dtw_token_timestamps;
  *(int3 *)&(wctx->params).field_0x9 = params._9_3_;
  (wctx->params).dtw_aheads_preset = params.dtw_aheads_preset;
  bVar5 = whisper_model_load(loader,wctx);
  (*loader->close)(loader->context);
  if (!bVar5) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: failed to load model\n","whisper_init_with_params_no_state"
              );
    pcVar3 = (wctx->path_model)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar2) {
      operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&(wctx->vocab).id_to_token._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&(wctx->vocab).token_to_id._M_t);
    whisper_model::~whisper_model(&wctx->model);
    operator_delete(wctx,0x248);
    wctx = (whisper_context *)0x0;
  }
  return wctx;
}

Assistant:

struct whisper_context * whisper_init_with_params_no_state(struct whisper_model_loader * loader, struct whisper_context_params params) {
    ggml_time_init();

    if (params.flash_attn && params.dtw_token_timestamps) {
        WHISPER_LOG_WARN("%s: dtw_token_timestamps is not supported with flash_attn - disabling\n", __func__);
        params.dtw_token_timestamps = false;
    }

    WHISPER_LOG_INFO("%s: use gpu    = %d\n", __func__, params.use_gpu);
    WHISPER_LOG_INFO("%s: flash attn = %d\n", __func__, params.flash_attn);
    WHISPER_LOG_INFO("%s: gpu_device = %d\n", __func__, params.gpu_device);
    WHISPER_LOG_INFO("%s: dtw        = %d\n", __func__, params.dtw_token_timestamps);
    WHISPER_LOG_INFO("%s: devices    = %zu\n", __func__, ggml_backend_dev_count());
    WHISPER_LOG_INFO("%s: backends   = %zu\n", __func__, ggml_backend_reg_count());

    whisper_context * ctx = new whisper_context;
    ctx->params = params;

    if (!whisper_model_load(loader, *ctx)) {
        loader->close(loader->context);
        WHISPER_LOG_ERROR("%s: failed to load model\n", __func__);
        delete ctx;
        return nullptr;
    }

    loader->close(loader->context);

    return ctx;
}